

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O1

UBool uloc_isRightToLeft_63(char *locale)

{
  UBool UVar1;
  int32_t iVar2;
  UScriptCode script_00;
  char *pcVar3;
  bool bVar4;
  UErrorCode errorCode;
  char script [8];
  char lang [8];
  char likely [157];
  UErrorCode local_cc;
  char local_c8 [8];
  char local_c0 [8];
  char local_b8 [160];
  
  local_cc = U_ZERO_ERROR;
  iVar2 = uloc_getScript_63(locale,local_c8,8,&local_cc);
  if (((local_cc < U_ILLEGAL_ARGUMENT_ERROR) && (local_cc != U_STRING_NOT_TERMINATED_WARNING)) &&
     (iVar2 != 0)) goto LAB_0029a607;
  local_cc = U_ZERO_ERROR;
  iVar2 = uloc_getLanguage_63(locale,local_c0,8,&local_cc);
  bVar4 = false;
  UVar1 = '\0';
  if ((iVar2 != 0 && local_cc != U_STRING_NOT_TERMINATED_WARNING) &&
      local_cc < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar3 = strstr("root-en-es-pt-zh-ja-ko-de-fr-it-ar+he+fa+ru-nl-pl-th-tr-",local_c0);
    if (pcVar3 == (char *)0x0) {
LAB_0029a596:
      local_cc = U_ZERO_ERROR;
      uloc_addLikelySubtags_63(locale,local_b8,0x9d,&local_cc);
      if (local_cc == U_STRING_NOT_TERMINATED_WARNING || U_ZERO_ERROR < local_cc) goto LAB_0029a5c9;
      iVar2 = uloc_getScript_63(local_b8,local_c8,8,&local_cc);
      bVar4 = (iVar2 != 0 && local_cc != U_STRING_NOT_TERMINATED_WARNING) &&
              local_cc < U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if (pcVar3[iVar2] != '-') {
        if (pcVar3[iVar2] == '+') {
          UVar1 = '\x01';
          bVar4 = false;
          goto LAB_0029a603;
        }
        goto LAB_0029a596;
      }
LAB_0029a5c9:
      bVar4 = false;
    }
    UVar1 = '\0';
  }
LAB_0029a603:
  if (!bVar4) {
    return UVar1;
  }
LAB_0029a607:
  script_00 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,local_c8);
  UVar1 = uscript_isRightToLeft_63(script_00);
  return UVar1;
}

Assistant:

U_CAPI UBool U_EXPORT2
uloc_isRightToLeft(const char *locale) {
    UErrorCode errorCode = U_ZERO_ERROR;
    char script[8];
    int32_t scriptLength = uloc_getScript(locale, script, UPRV_LENGTHOF(script), &errorCode);
    if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING ||
            scriptLength == 0) {
        // Fastpath: We know the likely scripts and their writing direction
        // for some common languages.
        errorCode = U_ZERO_ERROR;
        char lang[8];
        int32_t langLength = uloc_getLanguage(locale, lang, UPRV_LENGTHOF(lang), &errorCode);
        if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING ||
                langLength == 0) {
            return FALSE;
        }
        const char* langPtr = uprv_strstr(LANG_DIR_STRING, lang);
        if (langPtr != NULL) {
            switch (langPtr[langLength]) {
            case '-': return FALSE;
            case '+': return TRUE;
            default: break;  // partial match of a longer code
            }
        }
        // Otherwise, find the likely script.
        errorCode = U_ZERO_ERROR;
        char likely[ULOC_FULLNAME_CAPACITY];
        (void)uloc_addLikelySubtags(locale, likely, UPRV_LENGTHOF(likely), &errorCode);
        if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING) {
            return FALSE;
        }
        scriptLength = uloc_getScript(likely, script, UPRV_LENGTHOF(script), &errorCode);
        if (U_FAILURE(errorCode) || errorCode == U_STRING_NOT_TERMINATED_WARNING ||
                scriptLength == 0) {
            return FALSE;
        }
    }
    UScriptCode scriptCode = (UScriptCode)u_getPropertyValueEnum(UCHAR_SCRIPT, script);
    return uscript_isRightToLeft(scriptCode);
}